

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-sve.inc.c
# Opt level: O0

void disas_sve_extract_disas_sve_Fmt_83
               (DisasContext_conflict1 *ctx,arg_disas_sve44 *a,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t insn_local;
  arg_disas_sve44 *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32(insn,0x14,1);
  a->index = uVar1;
  uVar1 = extract32(insn,0x10,4);
  a->rm = uVar1;
  uVar1 = extract32(insn,10,1);
  a->sub = uVar1;
  uVar1 = extract32(insn,5,5);
  a->rn = uVar1;
  uVar1 = extract32(insn,0,5);
  a->rd = uVar1;
  uVar1 = extract32(insn,0,5);
  a->ra = uVar1;
  a->esz = 3;
  return;
}

Assistant:

static void disas_sve_extract_disas_sve_Fmt_83(DisasContext *ctx, arg_disas_sve44 *a, uint32_t insn)
{
    a->index = extract32(insn, 20, 1);
    a->rm = extract32(insn, 16, 4);
    a->sub = extract32(insn, 10, 1);
    a->rn = extract32(insn, 5, 5);
    a->rd = extract32(insn, 0, 5);
    a->ra = extract32(insn, 0, 5);
    a->esz = 3;
}